

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTS_vocoder.c
# Opt level: O3

double HTS_white_noise(HTS_Vocoder *v)

{
  uint uVar1;
  uint uVar2;
  unsigned_long uVar3;
  long lVar4;
  double *pdVar5;
  bool bVar6;
  double dVar7;
  double dVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  double dVar11;
  
  if (v->gauss == '\0') {
    uVar1 = v->x;
    bVar6 = (uVar1 & 2) == 0;
    uVar2 = (uVar1 >> 1) + 0x80000000;
    if (bVar6 == ((uVar1 >> 0x1d & 1) == 0)) {
      uVar2 = uVar1 >> 1;
    }
    v->x = uVar2;
    dVar7 = (double)(int)(-(uint)bVar6 | 1);
  }
  else {
    if (v->sw == '\0') {
      v->sw = '\x01';
      uVar3 = v->next;
      do {
        do {
          lVar4 = uVar3 * 0x41c64e6d + 0x3039;
          uVar3 = lVar4 * 0x41c64e6d + 0x3039;
          auVar10._0_4_ = (undefined4)((ulong)lVar4 >> 0x10);
          auVar10._8_4_ = (undefined4)(uVar3 >> 0x10);
          auVar10._4_4_ = auVar10._8_4_;
          auVar10._12_2_ = (short)(uVar3 >> 0x30);
          auVar10._14_2_ = 0;
          auVar9._0_8_ = (double)SUB164(auVar10 & _DAT_001612e0,0);
          auVar9._8_8_ = (double)SUB164(auVar10 & _DAT_001612e0,4);
          auVar10 = divpd(auVar9,_DAT_001612f0);
          dVar8 = auVar10._0_8_ + auVar10._0_8_ + -1.0;
          dVar11 = auVar10._8_8_ + auVar10._8_8_ + -1.0;
          dVar7 = dVar8 * dVar8 + dVar11 * dVar11;
        } while (1.0 < dVar7);
      } while ((dVar7 == 0.0) && (!NAN(dVar7)));
      v->next = uVar3;
      v->r1 = dVar8;
      v->r2 = dVar11;
      v->s = dVar7;
      dVar7 = log(dVar7);
      dVar7 = (dVar7 * -2.0) / v->s;
      if (dVar7 < 0.0) {
        dVar7 = sqrt(dVar7);
      }
      else {
        dVar7 = SQRT(dVar7);
      }
      v->s = dVar7;
      pdVar5 = &v->r1;
    }
    else {
      v->sw = '\0';
      dVar7 = v->r2;
      pdVar5 = &v->s;
    }
    dVar7 = dVar7 * *pdVar5;
  }
  return dVar7;
}

Assistant:

static double HTS_white_noise(HTS_Vocoder * v)
{
   if (v->gauss)
      return (double) HTS_nrandom(v);
   else
      return (double) HTS_mseq(v);
}